

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_specialization_constant_op
          (CompilerGLSL *this,SPIRConstantOp *constant)

{
  bool bVar1;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string name;
  
  type = Compiler::get<diligent_spirv_cross::SPIRType>
                   (&this->super_Compiler,(constant->basetype).id);
  bVar1 = Compiler::type_is_top_level_block(&this->super_Compiler,type);
  if (!bVar1) {
    add_resource_name(this,(constant->super_IVariant).self.id);
    (*(this->super_Compiler)._vptr_Compiler[6])
              (&name,this,(ulong)(constant->super_IVariant).self.id,1);
    (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_60,this,type,&name,0);
    (*(this->super_Compiler)._vptr_Compiler[0x18])(&local_80,this,constant);
    statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (this,(char (*) [7])0x7fbf4d,&local_60,(char (*) [4])0x7dcf83,&local_80,
               (char (*) [2])0x800eb9);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_specialization_constant_op(const SPIRConstantOp &constant)
{
	auto &type = get<SPIRType>(constant.basetype);
	// This will break. It is bogus and should not be legal.
	if (type_is_top_level_block(type))
		return;
	add_resource_name(constant.self);
	auto name = to_name(constant.self);
	statement("const ", variable_decl(type, name), " = ", constant_op_expression(constant), ";");
}